

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O1

void __thiscall FString::FString(FString *this,char *head,FString *tail)

{
  size_t __n;
  FStringData *pFVar1;
  ulong __n_00;
  size_t strlen;
  void *__dest;
  
  __n = ::strlen(head);
  strlen = *(uint *)(tail->Chars + -0xc) + __n;
  pFVar1 = FStringData::Alloc(strlen);
  this->Chars = (char *)(pFVar1 + 1);
  pFVar1->Len = (uint)strlen;
  memcpy(pFVar1 + 1,head,__n);
  __dest = (void *)((long)&pFVar1[1].Len + __n);
  *(undefined1 *)((long)&pFVar1[1].Len + __n) = 0;
  __n_00 = (ulong)*(uint *)(tail->Chars + -0xc);
  memcpy(__dest,tail->Chars,__n_00);
  *(undefined1 *)(__n_00 + (long)__dest) = 0;
  return;
}

Assistant:

FString::FString (const char *head, const FString &tail)
{
	size_t len1 = strlen (head);
	size_t len2 = tail.Len();
	AllocBuffer (len1 + len2);
	StrCopy (Chars, head, len1);
	StrCopy (Chars + len1, tail);
}